

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void shadow_textprintf(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,int align,char *format,...)

{
  char in_AL;
  uint uVar1;
  uint uVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int iVar3;
  char *in_R8;
  undefined8 in_R9;
  ALLEGRO_FONT *in_XMM0_Qa;
  int iVar4;
  int iVar5;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined1 local_318 [40];
  undefined8 local_2f0;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  ALLEGRO_FONT *local_268;
  int local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined1 *local_250;
  undefined1 *local_248;
  char local_238 [464];
  
  if (in_AL != '\0') {
    local_2c8 = in_XMM2_Qa;
    local_2b8 = in_XMM3_Qa;
    local_2a8 = in_XMM4_Qa;
    local_298 = in_XMM5_Qa;
    local_288 = in_XMM6_Qa;
    local_278 = in_XMM7_Qa;
  }
  local_248 = local_318;
  local_250 = &stack0x00000008;
  local_254 = 0x50;
  local_258 = 0x28;
  _iVar5 = _iVar4;
  local_2f0 = in_R9;
  vsnprintf(local_238,0x200,in_R8,&local_258);
  uVar1 = in_ESI + shadow_offset;
  uVar2 = in_EDX + shadow_offset;
  local_268 = (ALLEGRO_FONT *)al_map_rgba(0,0,0,0x80);
  _local_260 = _iVar5;
  demo_textprintf_ex(local_268,_iVar5,_iVar3,(ulong)uVar1,(int)(ulong)uVar2,(char *)(ulong)in_ECX,
                     "%s",local_238);
  demo_textprintf_ex(in_XMM0_Qa,_iVar4,_iVar3,(ulong)in_ESI,(int)(ulong)in_EDX,(char *)(ulong)in_ECX
                     ,"%s",local_238);
  return;
}

Assistant:

void shadow_textprintf(ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, int align, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   demo_textprintf_ex(font, x + shadow_offset, y + shadow_offset, al_map_rgba(0, 0, 0, 128),
                   align, "%s", buf);
   demo_textprintf_ex(font, x, y, col, align, "%s", buf);
}